

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

TryStmt * new_try_stmt(void *block,List *stmts,void *finally)

{
  Token *pTVar1;
  void *any;
  TryStmt *pTVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x28);
  pTVar2 = (TryStmt *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node((Token *)0x0,try_eval);
  pTVar1 = pTVar3->token;
  (pTVar2->node).eval = pTVar3->eval;
  (pTVar2->node).token = pTVar1;
  pTVar2->block = block;
  pTVar2->stmts = stmts;
  pTVar2->stmt = finally;
  return pTVar2;
}

Assistant:

TryStmt *new_try_stmt(void *block, List *stmts, void *finally) {
    TryStmt *stmt = new(TryStmt);
    stmt->node = tree_node_(NULL, eval_handler(try_eval));
    stmt->block = block;
    stmt->stmts = stmts;
    stmt->stmt = finally;
    return stmt;
}